

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_init.c
# Opt level: O2

RK_S32 compare_pic_by_pic_num_desc(void *arg1,void *arg2)

{
  RK_S32 RVar1;
  
  RVar1 = 1;
  if (*(int *)(*arg2 + 0x18) <= *(int *)(*arg1 + 0x18)) {
    RVar1 = -(uint)(*(int *)(*arg2 + 0x18) < *(int *)(*arg1 + 0x18));
  }
  return RVar1;
}

Assistant:

static RK_S32 compare_pic_by_pic_num_desc(const void *arg1, const void *arg2)
{
    RK_S32 pic_num1 = (*(H264_StorePic_t**)arg1)->pic_num;
    RK_S32 pic_num2 = (*(H264_StorePic_t**)arg2)->pic_num;

    if (pic_num1 < pic_num2)
        return 1;
    if (pic_num1 > pic_num2)
        return -1;
    else
        return 0;
}